

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# JUnitOutputTest.cpp
# Opt level: O3

void __thiscall
TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test::
~TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test
          (TEST_JUnitOutputTest_withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks_Test
           *this)

{
  Utest::~Utest((Utest *)this);
  operator_delete(this,0x28);
  return;
}

Assistant:

TEST(JUnitOutputTest, withOneTestGroupAndOneTestOutputsTestSuiteStartAndEndBlocks)
{
    testCaseRunner->start()
            .withGroup("groupname").withTest("testname")
            .end();

    outputFile = fileSystem.file("cpputest_groupname.xml");
    STRCMP_EQUAL("<testsuite errors=\"0\" failures=\"0\" hostname=\"localhost\" name=\"groupname\" tests=\"1\" time=\"0.000\" timestamp=\"1978-10-03T00:00:00\">\n", outputFile->line(2));
    STRCMP_EQUAL("</testsuite>\n", outputFile->lineFromTheBack(1));
}